

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
phmap::priv::
btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
::erase(btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
        *this,iterator iter)

{
  iterator iVar1;
  iterator iVar2;
  btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>_>
  *this_local;
  iterator iter_local;
  
  iVar1._12_4_ = 0;
  iVar1.node = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                *)SUB128(iter._0_12_,0);
  iVar1.position = SUB124(iter._0_12_,8);
  iVar1 = btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
          ::erase(&this->tree_,iVar1);
  iVar2._12_4_ = 0;
  iVar2.node = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                *)SUB128(iVar1._0_12_,0);
  iVar2.position = SUB124(iVar1._0_12_,8);
  return iVar2;
}

Assistant:

iterator erase(iterator iter)       { return tree_.erase(iter); }